

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O3

void deserialize_run_container_empty(void)

{
  uint8_t data [11];
  undefined7 local_10;
  undefined4 uStack_9;
  
  local_10 = 0x10000303b;
  uStack_9 = 0;
  invalid_deserialize_test(&local_10,0xb,"empty run container");
  return;
}

Assistant:

DEFINE_TEST(deserialize_run_container_empty) {
    // clang-format off
    const uint8_t data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0x01,       // Run Flag Bitset (single container is a run)
        0, 0,       // Upper 16 bits of the first container
        0, 0,       // Cardinality - 1 of the first container
        0, 0,       // First Container - Number of runs
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "empty run container");
}